

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinNFA.cpp
# Opt level: O0

void __thiscall
la::LevenshteinNFA::LevenshteinNFA
          (LevenshteinNFA *this,size_t size,int initialstate,
          list<int,_std::allocator<int>_> *finalStates)

{
  size_type __n;
  allocator_type local_2a;
  value_type local_29;
  list<int,_std::allocator<int>_> *local_28;
  list<int,_std::allocator<int>_> *finalStates_local;
  size_t sStack_18;
  int initialstate_local;
  size_t size_local;
  LevenshteinNFA *this_local;
  
  this->_initialState = initialstate;
  local_28 = finalStates;
  finalStates_local._4_4_ = initialstate;
  sStack_18 = size;
  size_local = (size_t)this;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&this->_finalStates,finalStates);
  std::forward_list<char,_std::allocator<char>_>::forward_list(&this->_inputs);
  __n = sStack_18 * sStack_18;
  local_29 = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&this->_transTable,__n,&local_29,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  this->_size = sStack_18;
  return;
}

Assistant:

LevenshteinNFA::LevenshteinNFA(std::size_t size, int initialstate, std::list<int> &&finalStates)
        : _initialState{initialstate},
          _size{size},
          _finalStates{std::move(finalStates)},
          _transTable(size * size, '\0') {}